

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  GeneticAlgorithm geneticAlgorithm;
  GeneticAlgorithm local_28;
  
  local_28.generations.super__Vector_base<Population,_std::allocator<Population>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.generations.super__Vector_base<Population,_std::allocator<Population>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.generations.super__Vector_base<Population,_std::allocator<Population>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GeneticAlgorithm::run(&local_28);
  std::vector<Population,_std::allocator<Population>_>::~vector(&local_28.generations);
  return 0;
}

Assistant:

int main() {
    GeneticAlgorithm geneticAlgorithm;
    geneticAlgorithm.run();

/*
    int position = 4;


    std::vector<std::string> list1 = {"0", "1", "2", "3", "4", "5", "6", "7", "8", "9",};
    std::vector<std::string> list2 = {"A", "B", "C", "D", "E", "F", "G", "H", "I", "J",};

    auto it1 = list1.begin();
    std::advance(it1, position);
    auto it2 = list2.begin();
    std::advance(it2, position);


    std::vector<std::string> nlist1;
    std::vector<std::string> nlist2;
    nlist1.insert(nlist1.begin(), list1.begin(), it1);
    nlist1.insert(nlist1.end(), it2, list2.end());
    nlist2.insert(nlist2.begin(), list2.begin(), it2);
    nlist2.insert(nlist2.end(), it1, list1.end());


    std::cout << "list1: " << list1 << "\n";
    std::cout << "list2: " << list2 << "\n";
    std::cout << "nlist1: " << nlist1 << "\n";
    std::cout << "nlist2: " << nlist2 << "\n";*/

    return 0;
}